

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

optional<unsigned_long> kratos::SSATransformFixVisitor::get_target_scope(Var *var)

{
  int iVar1;
  pointer psVar2;
  char *__nptr;
  long lVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  _Storage<unsigned_long,_true> unaff_R14;
  pointer psVar6;
  optional<unsigned_long> oVar7;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  
  psVar6 = (var->super_IRNode).attributes_.
           super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (var->super_IRNode).attributes_.
           super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar6 == psVar2) {
      uVar5 = 0;
LAB_001fc7b7:
      oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = uVar5;
      oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_R14._M_value;
      return (optional<unsigned_long>)
             oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>;
    }
    unaff_R14._M_value =
         (unsigned_long)
         &((psVar6->super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          value_str;
    lVar3 = std::__cxx11::string::rfind((char *)unaff_R14,0x25022f,0xffffffffffffffff);
    if (lVar3 == 0) {
      std::__cxx11::string::substr((ulong)&local_58,unaff_R14._M_value);
      __nptr = local_58;
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      *piVar4 = 0;
      unaff_R14._M_value = strtoul(__nptr,(char **)((long)&v.field_2 + 8),10);
      if ((char *)v.field_2._8_8_ == __nptr) {
        uVar5 = std::__throw_invalid_argument("stoul");
        if (*piVar4 == 0) {
          *piVar4 = iVar1;
        }
        get_target_scope();
        _Unwind_Resume(uVar5);
      }
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
      }
      else if (*piVar4 == 0x22) {
        std::__throw_out_of_range("stoul");
      }
      uVar5 = extraout_RDX;
      if ((size_type *)local_58 != &v._M_string_length) {
        operator_delete(local_58,v._M_string_length + 1);
        uVar5 = extraout_RDX_00;
      }
      uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
      goto LAB_001fc7b7;
    }
    psVar6 = psVar6 + 1;
  } while( true );
}

Assistant:

static std::optional<uint64_t> get_target_scope(const Var *var) {
        auto const &attrs = var->get_attributes();
        for (auto const &attr : attrs) {
            auto const &value_str = attr->value_str;
            auto pos = value_str.rfind("ssa-scope=");
            if (pos == 0) {
                auto v = value_str.substr(10);
                return std::stoul(v);
            }
        }
        return std::nullopt;
    }